

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_exception.hpp
# Opt level: O2

void __thiscall
duckdb::ParserException::ParserException<double>(ParserException *this,string *msg,double params)

{
  string local_30;
  
  Exception::ConstructMessage<double>(&local_30,msg,params);
  ParserException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit ParserException(const string &msg, ARGS... params) : ParserException(ConstructMessage(msg, params...)) {
	}